

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
* Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *v1,vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *v2)

{
  long lVar1;
  bool bVar2;
  size_type in_RDX;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_RSI;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_RDI;
  long in_FS_OFFSET;
  Tracker *arg;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *__range1;
  iterator __end0;
  iterator __begin0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_stack_ffffffffffffff98;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::size(in_stack_ffffffffffffff98);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::size(in_stack_ffffffffffffff98);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(in_RSI,in_RDX);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::begin(in_RDI);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
                      ((__normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
                        *)__lhs,(__normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
                                 *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
    ::operator*((__normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
                 *)in_stack_ffffffffffffff98);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::push_back(in_stack_ffffffffffffff98,(value_type *)0xc8408e);
    __gnu_cxx::
    __normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
    ::operator++((__normal_iterator<util_tests::(anonymous_namespace)::Tracker_*,_std::vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>_>
                  *)in_stack_ffffffffffffff98);
  }
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector(in_stack_ffffffffffffff98,
           (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)0xc840a9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}